

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

void raviX_hash_table_destroy(HashTable *ht,_func_void_HashEntry_ptr *delete_function)

{
  HashEntry *pHVar1;
  long lVar2;
  HashEntry *ptr;
  HashEntry *pHVar3;
  HashEntry *pHVar4;
  
  if (ht == (HashTable *)0x0) {
    return;
  }
  ptr = ht->table;
  if ((delete_function != (_func_void_HashEntry_ptr *)0x0) && ((ulong)ht->size != 0)) {
    lVar2 = (ulong)ht->size * 0x18;
    pHVar3 = ptr;
    do {
      if ((uint32_t *)pHVar3->key != &deleted_key_value &&
          (uint32_t *)pHVar3->key != (uint32_t *)0x0) {
        do {
          (*delete_function)(pHVar3);
          ptr = ht->table;
          pHVar4 = pHVar3;
          do {
            pHVar3 = pHVar4 + 1;
            if (pHVar3 == ptr + ht->size) goto LAB_0010d26a;
            pHVar1 = pHVar4 + 1;
            pHVar4 = pHVar3;
          } while ((uint32_t *)pHVar1->key == (uint32_t *)0x0 ||
                   (uint32_t *)pHVar1->key == &deleted_key_value);
        } while( true );
      }
      pHVar3 = pHVar3 + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
LAB_0010d26a:
  raviX_free(ptr);
  raviX_free(ht);
  return;
}

Assistant:

void
raviX_hash_table_destroy(HashTable *ht,
		   void (*delete_function)(HashEntry *entry))
{
	if (!ht)
		return;

	if (delete_function) {
		HashEntry *entry;

		hash_table_foreach(ht, entry) {
			delete_function(entry);
		}
	}
	raviX_free(ht->table);
	raviX_free(ht);
}